

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  ostream *poVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  AssertionPrinter printer;
  AssertionPrinter local_b0;
  
  iVar4 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[7])();
  if (((char)iVar4 != '\0') ||
     ((bVar3 = false,
      ((_assertionStats->assertionResult).m_resultData.resultType & FailureBit) != Ok &&
      (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == Normal)))) {
    lazyPrint(this);
    AssertionPrinter::AssertionPrinter
              (&local_b0,(this->super_StreamingReporterBase).stream,_assertionStats);
    AssertionPrinter::print(&local_b0);
    poVar1 = (this->super_StreamingReporterBase).stream;
    cVar2 = (char)poVar1;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
              (&local_b0.messages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.message._M_dataplus._M_p != &local_b0.message.field_2) {
      operator_delete(local_b0.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.messageLabel._M_dataplus._M_p != &local_b0.messageLabel.field_2) {
      operator_delete(local_b0.messageLabel._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.passOrFail._M_dataplus._M_p != &local_b0.passOrFail.field_2) {
      operator_delete(local_b0.passOrFail._M_dataplus._M_p);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() )
                return false;

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats );
            printer.print();
            stream << std::endl;
            return true;
        }